

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

StructSchema __thiscall capnp::Schema::asStruct(Schema *this)

{
  bool bVar1;
  Reader local_90;
  ArrayPtr<const_char> local_60;
  Fault local_50;
  Fault f;
  Schema *this_local;
  
  getProto((Reader *)&f,this);
  bVar1 = capnp::schema::Node::Reader::isStruct((Reader *)&f);
  if (bVar1) {
    StructSchema::StructSchema((StructSchema *)&this_local,(Schema)this->raw);
  }
  else {
    getProto(&local_90,this);
    local_60 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_90);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44],capnp::Text::Reader>
              (&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
               ,0x10d,FAILED,"getProto().isStruct()",
               "\"Tried to use non-struct schema as a struct.\", getProto().getDisplayName()",
               (char (*) [44])"Tried to use non-struct schema as a struct.",(Reader *)&local_60);
    StructSchema::StructSchema((StructSchema *)&this_local);
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  return (StructSchema)(Schema)this_local;
}

Assistant:

StructSchema Schema::asStruct() const {
  KJ_REQUIRE(getProto().isStruct(), "Tried to use non-struct schema as a struct.",
             getProto().getDisplayName()) {
    return StructSchema();
  }
  return StructSchema(*this);
}